

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O1

int __thiscall pstore::file::file_handle::rename(file_handle *this,char *__old,char *__new)

{
  pointer pcVar1;
  char *__to;
  _Alloc_hider __from;
  int iVar2;
  long lVar3;
  uint *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  uint uVar7;
  ostringstream message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [376];
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  pcVar1 = (this->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + (this->path_)._M_string_length);
  __from._M_p = local_1e8._M_dataplus._M_p;
  __to = *(char **)__old;
  iVar6 = 0;
  lVar3 = syscall(0x13c,0xffffff9c,local_1e8._M_dataplus._M_p,0xffffff9c,__to,1);
  puVar4 = (uint *)__errno_location();
  if (-1 < lVar3) goto LAB_001a1bb3;
  uVar7 = *puVar4;
  if ((uVar7 < 0x27) && ((0x4002400000U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
    iVar6 = 0;
    iVar2 = linkat(-100,__from._M_p,-100,__to,0);
    if (-1 < iVar2) {
      iVar2 = unlinkat(-100,__from._M_p,0);
      if (iVar2 < 0) {
        iVar6 = -*puVar4;
        unlinkat(-100,__to,0);
      }
      goto LAB_001a1bb3;
    }
    uVar7 = *puVar4;
    if ((uVar7 == 1) || (uVar7 == 0x16 || (uVar7 == 0x19 || uVar7 == 0x26))) {
      iVar2 = faccessat(-100,__to,0,0x100);
      iVar6 = -0x11;
      if (-1 < iVar2) goto LAB_001a1bb3;
      uVar7 = *puVar4;
      if (uVar7 == 2) {
        iVar2 = renameat(-100,__from._M_p,-100,__to);
        iVar6 = 0;
        if (iVar2 < 0) {
          iVar6 = -*puVar4;
        }
        goto LAB_001a1bb3;
      }
    }
  }
  iVar6 = -uVar7;
LAB_001a1bb3:
  if (iVar6 < 0) {
    if (iVar6 != -0x11) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unable to rename ",0x11);
      local_1c8._M_string_length._0_2_ = 0x22;
      local_1c8._M_dataplus._M_p = (pointer)&local_1e8;
      std::__detail::operator<<
                ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
                 (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                  *)&local_1c8);
      std::__cxx11::stringbuf::str();
      raise<pstore::errno_erc,std::__cxx11::string>((errno_erc)-iVar6,&local_1c8);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->path_);
  }
  paVar5 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar5) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    paVar5 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)paVar5 >> 8),-1 < iVar6);
}

Assistant:

bool file_handle::rename (std::string const & new_name) {
            bool result = true;
            auto const & path = this->path ();
            int err = rename_noreplace (path.c_str (), new_name.c_str ());
            if (err >= 0) {
                path_ = new_name;
            } else {
                err = -err;
                if (err == EEXIST) {
                    result = false;
                } else {
                    std::ostringstream message;
                    message << "Unable to rename " << pstore::quoted (path);
                    raise (errno_erc{err}, message.str ());
                }
            }
            return result;
        }